

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O2

void trc_apply_level_by_name(Curl_str *token,int lvl)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 + 0x10 == 0xe0) goto LAB_00121eb1;
    puVar1 = *(undefined8 **)((long)&trc_cfts[0].cft + lVar3);
    iVar2 = Curl_str_casecompare(token,(char *)*puVar1);
    lVar3 = lVar3 + 0x10;
  } while (iVar2 == 0);
  *(int *)((long)puVar1 + 0xc) = lvl;
LAB_00121eb1:
  lVar3 = 0;
  do {
    if (lVar3 + 0x10 == 0xa0) {
      return;
    }
    puVar1 = *(undefined8 **)((long)&trc_feats[0].feat + lVar3);
    iVar2 = Curl_str_casecompare(token,(char *)*puVar1);
    lVar3 = lVar3 + 0x10;
  } while (iVar2 == 0);
  *(int *)(puVar1 + 1) = lvl;
  return;
}

Assistant:

static void trc_apply_level_by_name(struct Curl_str *token, int lvl)
{
  size_t i;

  for(i = 0; i < CURL_ARRAYSIZE(trc_cfts); ++i) {
    if(Curl_str_casecompare(token, trc_cfts[i].cft->name)) {
      trc_cfts[i].cft->log_level = lvl;
      break;
    }
  }
  for(i = 0; i < CURL_ARRAYSIZE(trc_feats); ++i) {
    if(Curl_str_casecompare(token, trc_feats[i].feat->name)) {
      trc_feats[i].feat->log_level = lvl;
      break;
    }
  }
}